

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprAddCollateString(Parse *pParse,Expr *pExpr,char *zC)

{
  Expr *pEVar1;
  Token s;
  Token local_28;
  
  local_28.z = zC;
  local_28.n = sqlite3Strlen30(zC);
  pEVar1 = sqlite3ExprAddCollateToken(pParse,pExpr,&local_28);
  return pEVar1;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateString(Parse *pParse, Expr *pExpr, const char *zC){
  Token s;
  assert( zC!=0 );
  s.z = zC;
  s.n = sqlite3Strlen30(s.z);
  return sqlite3ExprAddCollateToken(pParse, pExpr, &s);
}